

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mul(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_2;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i64(tcg_ctx);
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  ret_01 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_mov_i64_ppc64(tcg_ctx,ret,cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f]);
  tcg_gen_mov_i64_ppc64
            (tcg_ctx,ret_00,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8)));
  tcg_gen_mul_i64_ppc64(tcg_ctx,ret,ret,ret_00);
  tcg_gen_mov_i64_ppc64(tcg_ctx,ret_01,ret);
  gen_store_spr(tcg_ctx,0,ret_01);
  tcg_gen_shri_i64_ppc64(tcg_ctx,ret_00,ret,0x20);
  tcg_gen_mov_i64_ppc64
            (tcg_ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),ret_00);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
  if ((ctx->opcode & 1) == 0) {
    return;
  }
  gen_set_Rc0(ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)));
  return;
}

Assistant:

static void gen_mul(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv t2 = tcg_temp_new(tcg_ctx);
    tcg_gen_extu_tl_i64(tcg_ctx, t0, cpu_gpr[rA(ctx->opcode)]);
    tcg_gen_extu_tl_i64(tcg_ctx, t1, cpu_gpr[rB(ctx->opcode)]);
    tcg_gen_mul_i64(tcg_ctx, t0, t0, t1);
    tcg_gen_trunc_i64_tl(tcg_ctx, t2, t0);
    gen_store_spr(tcg_ctx, SPR_MQ, t2);
    tcg_gen_shri_i64(tcg_ctx, t1, t0, 32);
    tcg_gen_trunc_i64_tl(tcg_ctx, cpu_gpr[rD(ctx->opcode)], t1);
    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t2);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rD(ctx->opcode)]);
    }
}